

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

int Abc_ZddThresh(Abc_ZddMan *p,int a,int b)

{
  int iVar1;
  int True;
  Abc_ZddObj *pAVar2;
  int r;
  int r1;
  int r0;
  Abc_ZddObj *A;
  int b_local;
  int a_local;
  Abc_ZddMan *p_local;
  
  p_local._4_4_ = a;
  if (1 < a) {
    if (b == 0) {
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = Abc_ZddCacheLookup(p,a,b,9);
      if (p_local._4_4_ < 0) {
        pAVar2 = Abc_ZddNode(p,a);
        iVar1 = Abc_ZddThresh(p,pAVar2->False,b);
        True = Abc_ZddThresh(p,pAVar2->True,b + -1);
        iVar1 = Abc_ZddUniqueCreate(p,*(uint *)pAVar2 & 0x7fffffff,True,iVar1);
        p_local._4_4_ = Abc_ZddCacheInsert(p,a,b,9,iVar1);
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Abc_ZddThresh( Abc_ZddMan * p, int a, int b )
{
    Abc_ZddObj * A; 
    int r0, r1, r;
    if ( a < 2 )  return a;
    if ( b == 0 ) return 0;
    if ( (r = Abc_ZddCacheLookup(p, a, b, ABC_ZDD_OPER_THRESH)) >= 0 )
        return r;
    A  = Abc_ZddNode( p, a );
    r0 = Abc_ZddThresh( p, A->False, b ),
    r1 = Abc_ZddThresh( p, A->True, b-1 );
    r  = Abc_ZddUniqueCreate( p, A->Var, r1, r0 );
    return Abc_ZddCacheInsert( p, a, b, ABC_ZDD_OPER_THRESH, r );
}